

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O2

bool test_std_supports_SJIS_codecvt(string *locale_name)

{
  __type _Var1;
  locale local_270 [8];
  wstring cmp;
  wstring ref;
  ofstream f;
  
  std::ofstream::ofstream((ostream *)&f,"test-siftjis.txt",_S_out);
  std::operator<<((ostream *)&f,anon_var_dwarf_338f);
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  std::wfstream::wfstream(&f);
  std::locale::locale((locale *)&cmp,(locale_name->_M_dataplus)._M_p);
  std::wios::imbue(local_270);
  std::locale::~locale(local_270);
  std::locale::~locale((locale *)&cmp);
  std::wfstream::open((char *)&f,0x103288);
  std::__cxx11::wstring::wstring((wstring *)&cmp,L"日本",(allocator *)&ref);
  ref._M_dataplus._M_p = (pointer)&ref.field_2;
  ref._M_string_length = 0;
  ref.field_2._M_local_buf[0] = L'\0';
  std::operator>>((wistream *)&f,(wstring *)&ref);
  _Var1 = std::operator==(&ref,&cmp);
  std::__cxx11::wstring::~wstring((wstring *)&ref);
  std::__cxx11::wstring::~wstring((wstring *)&cmp);
  std::wfstream::~wfstream(&f);
  remove("test-siftjis.txt");
  return _Var1;
}

Assistant:

inline bool test_std_supports_SJIS_codecvt(std::string const &locale_name)
{
    bool res = true;
    {
    // Japan in Shift JIS/cp932
        char const *japan_932 = "\x93\xfa\x96\x7b";
        std::ofstream f("test-siftjis.txt");
        f<<japan_932;
        f.close();		
    }
    try {
        std::wfstream test;
        test.imbue(std::locale(locale_name.c_str()));
        test.open("test-siftjis.txt");
        // Japan in Unicode
        std::wstring cmp = L"\u65e5\u672c";
        std::wstring ref;
        test >> ref;
        res = ref == cmp;
    }
    catch(std::exception const &)
    {
        res = false;
    }
    remove("test-siftjis.txt");
    return res;
}